

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::PixelGameEngine::DrawRotatedDecal
          (PixelGameEngine *this,vf2d *pos,Decal *decal,float fAngle,vf2d *center,vf2d *scale,
          Pixel *tint)

{
  float fVar1;
  float fVar2;
  initializer_list<olc::Pixel> __l;
  initializer_list<float> __l_00;
  initializer_list<olc::v2d_generic<float>_> __l_01;
  float fVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  double dVar8;
  float fVar9;
  v2d_generic<float> local_1d0;
  undefined4 local_1c8;
  v2d_generic<float> local_1c4;
  v2d_generic<float> local_1bc;
  value_type local_1b4;
  v2d_generic<float> local_1ac;
  value_type local_1a4;
  int local_19c;
  float local_198;
  int i;
  float s;
  float c;
  v2d_generic<float> local_188;
  value_type local_180;
  v2d_generic<float> local_178;
  v2d_generic<float> local_170;
  value_type local_168;
  v2d_generic<float> local_160;
  v2d_generic<float> local_158;
  value_type local_150;
  v2d_generic<float> local_148;
  v2d_generic<float> local_140;
  value_type local_138;
  anon_union_4_2_12391da5_for_Pixel_0 local_130;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  anon_union_4_2_12391da5_for_Pixel_0 *local_120;
  undefined8 local_118;
  float local_110 [4];
  iterator local_100;
  undefined8 local_f8;
  v2d_generic<float> local_f0;
  v2d_generic<float> local_e8;
  v2d_generic<float> local_e0;
  v2d_generic<float> local_d8;
  iterator local_d0;
  undefined8 local_c8;
  undefined1 local_b0 [8];
  DecalInstance di;
  Pixel *tint_local;
  vf2d *scale_local;
  vf2d *center_local;
  float fAngle_local;
  Decal *decal_local;
  vf2d *pos_local;
  PixelGameEngine *this_local;
  
  di._104_8_ = tint;
  DecalInstance::DecalInstance((DecalInstance *)local_b0);
  local_b0 = (undefined1  [8])decal;
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)&di,4);
  v2d_generic<float>::v2d_generic(&local_f0,0.0,0.0);
  v2d_generic<float>::v2d_generic(&local_e8,0.0,1.0);
  v2d_generic<float>::v2d_generic(&local_e0,1.0,1.0);
  v2d_generic<float>::v2d_generic(&local_d8,1.0,0.0);
  local_d0 = &local_f0;
  local_c8 = 4;
  __l_01._M_len = 4;
  __l_01._M_array = local_d0;
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::operator=
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
             &di.pos.
              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l_01);
  local_110[0] = 1.0;
  local_110[1] = 1.0;
  local_110[2] = 1.0;
  local_110[3] = 1.0;
  local_100 = local_110;
  local_f8 = 4;
  __l_00._M_len = 4;
  __l_00._M_array = local_100;
  std::vector<float,_std::allocator<float>_>::operator=
            ((vector<float,_std::allocator<float>_> *)
             &di.uv.
              super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,__l_00);
  local_130 = *(anon_union_4_2_12391da5_for_Pixel_0 *)di._104_8_;
  local_12c = *(undefined4 *)di._104_8_;
  local_128 = *(undefined4 *)di._104_8_;
  local_124 = *(undefined4 *)di._104_8_;
  local_120 = &local_130;
  local_118 = 4;
  __l._M_len = 4;
  __l._M_array = (iterator)local_120;
  std::vector<olc::Pixel,_std::allocator<olc::Pixel>_>::operator=
            ((vector<olc::Pixel,_std::allocator<olc::Pixel>_> *)
             &di.w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,__l);
  di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  v2d_generic<float>::v2d_generic(&local_148,0.0,0.0);
  v2d_generic<float>::operator-(&local_140,&local_148);
  v2d_generic<float>::operator*(&local_138,&local_140);
  pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
           operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
                      &di,0);
  *pvVar5 = local_138;
  v2d_generic<float>::v2d_generic(&local_160,0.0,(float)decal->sprite->height);
  v2d_generic<float>::operator-(&local_158,&local_160);
  v2d_generic<float>::operator*(&local_150,&local_158);
  pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
           operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
                      &di,1);
  *pvVar5 = local_150;
  v2d_generic<float>::v2d_generic
            (&local_178,(float)decal->sprite->width,(float)decal->sprite->height);
  v2d_generic<float>::operator-(&local_170,&local_178);
  v2d_generic<float>::operator*(&local_168,&local_170);
  pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
           operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
                      &di,2);
  *pvVar5 = local_168;
  v2d_generic<float>::v2d_generic((v2d_generic<float> *)&s,(float)decal->sprite->width,0.0);
  v2d_generic<float>::operator-(&local_188,(v2d_generic<float> *)&s);
  v2d_generic<float>::operator*(&local_180,&local_188);
  pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
           operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
                      &di,3);
  *pvVar5 = local_180;
  dVar8 = cos((double)fAngle);
  i = (int)(float)dVar8;
  dVar8 = sin((double)fAngle);
  local_198 = (float)dVar8;
  for (local_19c = 0; local_19c < 4; local_19c = local_19c + 1) {
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_19c);
    iVar4 = i;
    fVar1 = pvVar5->x;
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_19c);
    fVar9 = pvVar5->y * local_198;
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_19c);
    fVar3 = local_198;
    fVar2 = pvVar5->x;
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_19c);
    v2d_generic<float>::v2d_generic
              (&local_1ac,fVar1 * (float)iVar4 - fVar9,fVar2 * fVar3 + pvVar5->y * (float)i);
    v2d_generic<float>::operator+(&local_1a4,pos);
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_19c);
    *pvVar5 = local_1a4;
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_19c);
    v2d_generic<float>::operator*(&local_1c4,pvVar5);
    local_1c8 = 0x40000000;
    v2d_generic<float>::operator*(&local_1bc,&local_1c4.x);
    v2d_generic<float>::v2d_generic(&local_1d0,1.0,1.0);
    v2d_generic<float>::operator-(&local_1b4,&local_1bc);
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_19c);
    *pvVar5 = local_1b4;
    pvVar5 = std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::
             operator[]((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         *)&di,(long)local_19c);
    pvVar5->y = pvVar5->y * -1.0;
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)
                        &di.uv.
                         super__Vector_base<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_19c);
    *pvVar6 = 1.0;
  }
  di.tint.super__Vector_base<olc::Pixel,_std::allocator<olc::Pixel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = this->nDecalMode;
  pvVar7 = std::vector<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>::operator[]
                     (&this->vLayers,(ulong)this->nTargetLayer);
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&pvVar7->vecDecalInstance,(value_type *)local_b0);
  DecalInstance::~DecalInstance((DecalInstance *)local_b0);
  return;
}

Assistant:

void PixelGameEngine::DrawRotatedDecal(const olc::vf2d& pos, olc::Decal* decal, const float fAngle, const olc::vf2d& center, const olc::vf2d& scale, const olc::Pixel& tint)
	{
		DecalInstance di;
		di.decal = decal;
		di.pos.resize(4);
		di.uv = { { 0.0f, 0.0f}, {0.0f, 1.0f}, {1.0f, 1.0f}, {1.0f, 0.0f} };
		di.w = { 1, 1, 1, 1 };
		di.tint = { tint, tint, tint, tint };
		di.points = 4;
		di.pos[0] = (olc::vf2d(0.0f, 0.0f) - center) * scale;
		di.pos[1] = (olc::vf2d(0.0f, float(decal->sprite->height)) - center) * scale;
		di.pos[2] = (olc::vf2d(float(decal->sprite->width), float(decal->sprite->height)) - center) * scale;
		di.pos[3] = (olc::vf2d(float(decal->sprite->width), 0.0f) - center) * scale;
		float c = cos(fAngle), s = sin(fAngle);
		for (int i = 0; i < 4; i++)
		{
			di.pos[i] = pos + olc::vf2d(di.pos[i].x * c - di.pos[i].y * s, di.pos[i].x * s + di.pos[i].y * c);
			di.pos[i] = di.pos[i] * vInvScreenSize * 2.0f - olc::vf2d(1.0f, 1.0f);
			di.pos[i].y *= -1.0f;
			di.w[i] = 1;
		}
		di.mode = nDecalMode;
		vLayers[nTargetLayer].vecDecalInstance.push_back(di);
	}